

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O3

void If_CluMoveVar(word *pF,int nVars,int *Var2Pla,int *Pla2Var,int v,int p)

{
  word *pwVar1;
  uint uVar2;
  word *pOut;
  ulong uVar3;
  int iVar;
  word *pIn;
  bool bVar4;
  word pG [1024];
  word local_2038 [1025];
  
  if ((v < 0) || (nVars <= v)) {
    __assert_fail("v >= 0 && v < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x336,"void If_CluMoveVar(word *, int, int *, int *, int, int)");
  }
  iVar = Var2Pla[(uint)v];
  if (iVar < p) {
    bVar4 = false;
    pwVar1 = local_2038;
    pOut = pF;
    do {
      pIn = pOut;
      pOut = pwVar1;
      If_CluSwapAdjacent(pOut,pIn,iVar,nVars);
      Var2Pla[Pla2Var[iVar]] = Var2Pla[Pla2Var[iVar]] + 1;
      Var2Pla[Pla2Var[(long)iVar + 1]] = Var2Pla[Pla2Var[(long)iVar + 1]] + -1;
      *(ulong *)(Pla2Var + iVar) =
           CONCAT44((int)*(undefined8 *)(Pla2Var + iVar),
                    (int)((ulong)*(undefined8 *)(Pla2Var + iVar) >> 0x20));
      bVar4 = (bool)(bVar4 ^ 1);
      iVar = Var2Pla[(uint)v];
      pwVar1 = pIn;
    } while (iVar < p);
  }
  else {
    bVar4 = false;
    pIn = local_2038;
    pOut = pF;
  }
  while (pwVar1 = pIn, p < iVar) {
    If_CluSwapAdjacent(pwVar1,pOut,iVar + -1,nVars);
    Var2Pla[Pla2Var[(long)iVar + -1]] = Var2Pla[Pla2Var[(long)iVar + -1]] + 1;
    Var2Pla[Pla2Var[iVar]] = Var2Pla[Pla2Var[iVar]] + -1;
    *(ulong *)(Pla2Var + (long)iVar + -1) =
         CONCAT44((int)*(undefined8 *)(Pla2Var + (long)iVar + -1),
                  (int)((ulong)*(undefined8 *)(Pla2Var + (long)iVar + -1) >> 0x20));
    bVar4 = (bool)(bVar4 ^ 1);
    pIn = pOut;
    pOut = pwVar1;
    iVar = Var2Pla[(uint)v];
  }
  if (bVar4) {
    uVar2 = 1 << ((char)nVars - 6U & 0x1f);
    if (nVars < 7) {
      uVar2 = 1;
    }
    if (0 < (int)uVar2) {
      uVar3 = 0;
      do {
        pF[uVar3] = pOut[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
  }
  if (Pla2Var[p] != v) {
    __assert_fail("Pla2Var[p] == v",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x353,"void If_CluMoveVar(word *, int, int *, int *, int, int)");
  }
  return;
}

Assistant:

void If_CluMoveVar( word * pF, int nVars, int * Var2Pla, int * Pla2Var, int v, int p )
{
    word pG[CLU_WRD_MAX], * pIn = pF, * pOut = pG, * pTemp;
    int iPlace0, iPlace1, Count = 0;
    assert( v >= 0 && v < nVars );
    while ( Var2Pla[v] < p )
    {
        iPlace0 = Var2Pla[v];
        iPlace1 = Var2Pla[v]+1;
        If_CluSwapAdjacent( pOut, pIn, iPlace0, nVars );
        pTemp = pIn; pIn = pOut, pOut = pTemp;
        Var2Pla[Pla2Var[iPlace0]]++;
        Var2Pla[Pla2Var[iPlace1]]--;
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Pla2Var[iPlace1] ^= Pla2Var[iPlace0];
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Count++;
    }
    while ( Var2Pla[v] > p )
    {
        iPlace0 = Var2Pla[v]-1;
        iPlace1 = Var2Pla[v];
        If_CluSwapAdjacent( pOut, pIn, iPlace0, nVars );
        pTemp = pIn; pIn = pOut, pOut = pTemp;
        Var2Pla[Pla2Var[iPlace0]]++;
        Var2Pla[Pla2Var[iPlace1]]--;
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Pla2Var[iPlace1] ^= Pla2Var[iPlace0];
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Count++;
    }
    if ( Count & 1 )
        If_CluCopy( pF, pIn, nVars );
    assert( Pla2Var[p] == v );
}